

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monotone.c
# Opt level: O0

int checkSanityOfKnownMonotone
              (Vec_Int_t *vKnownMonotone,Vec_Int_t *vCandMonotone,Vec_Int_t *vHintMonotone)

{
  int iVar1;
  uint uVar2;
  int local_28;
  int i;
  int iElem;
  Vec_Int_t *vHintMonotone_local;
  Vec_Int_t *vCandMonotone_local;
  Vec_Int_t *vKnownMonotone_local;
  
  for (local_28 = 0; iVar1 = Vec_IntSize(vKnownMonotone), local_28 < iVar1; local_28 = local_28 + 1)
  {
    uVar2 = Vec_IntEntry(vKnownMonotone,local_28);
    printf("%d ",(ulong)uVar2);
  }
  printf("\n");
  for (local_28 = 0; iVar1 = Vec_IntSize(vCandMonotone), local_28 < iVar1; local_28 = local_28 + 1)
  {
    uVar2 = Vec_IntEntry(vCandMonotone,local_28);
    printf("%d ",(ulong)uVar2);
  }
  printf("\n");
  for (local_28 = 0; iVar1 = Vec_IntSize(vHintMonotone), local_28 < iVar1; local_28 = local_28 + 1)
  {
    uVar2 = Vec_IntEntry(vHintMonotone,local_28);
    printf("%d ",(ulong)uVar2);
  }
  printf("\n");
  return 1;
}

Assistant:

int checkSanityOfKnownMonotone( Vec_Int_t *vKnownMonotone, Vec_Int_t *vCandMonotone, Vec_Int_t *vHintMonotone )
{
	int iElem, i;

	Vec_IntForEachEntry( vKnownMonotone, iElem, i )
		printf("%d ", iElem);
	printf("\n");
	Vec_IntForEachEntry( vCandMonotone, iElem, i )
		printf("%d ", iElem);
	printf("\n");
	Vec_IntForEachEntry( vHintMonotone, iElem, i )
		printf("%d ", iElem);
	printf("\n");
	return 1;
}